

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_invalid_normals_uvs_Test::~utObjImportExport_invalid_normals_uvs_Test
          (utObjImportExport_invalid_normals_uvs_Test *this)

{
  utObjImportExport_invalid_normals_uvs_Test *this_local;
  
  ~utObjImportExport_invalid_normals_uvs_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utObjImportExport, invalid_normals_uvs) {
    static const char *ObjModel =
        "v -0.500000 0.000000 0.400000\n"
        "v -0.500000 0.000000 -0.800000\n"
        "v -0.500000 1.000000 -0.800000\n"
		"vt 0 0\n"
		"vn 0 1 0\n"
        "f 1/1/1 1/1/1 2/2/2\nB";

    Assimp::Importer myImporter;
    const aiScene *scene = myImporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), 0);
    EXPECT_NE(nullptr, scene);
}